

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_add_ge(secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b)

{
  int iVar1;
  int iVar2;
  long in_RDX;
  void *in_RSI;
  void *in_RDI;
  int degenerate;
  secp256k1_fe rr_alt;
  secp256k1_fe m_alt;
  secp256k1_fe rr;
  secp256k1_fe q;
  secp256k1_fe n;
  secp256k1_fe m;
  secp256k1_fe tt;
  secp256k1_fe t;
  secp256k1_fe s2;
  secp256k1_fe s1;
  secp256k1_fe u2;
  secp256k1_fe u1;
  secp256k1_fe zz;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  undefined1 local_288 [240];
  undefined1 local_198 [96];
  undefined1 local_138 [96];
  undefined1 local_d8 [96];
  undefined1 local_78 [96];
  long local_18;
  void *local_10;
  void *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  secp256k1_gej_verify
            ((secp256k1_gej *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  secp256k1_ge_verify((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70))
  ;
  if (*(int *)(local_18 + 0x60) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/group_impl.h"
            ,0x2db,"test condition failed: !b->infinity");
    abort();
  }
  secp256k1_fe_sqr((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  memcpy(local_78,local_10,0x30);
  secp256k1_fe_mul((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   (secp256k1_fe *)0x10552d);
  memcpy(local_d8,(void *)((long)local_10 + 0x30),0x30);
  secp256k1_fe_mul((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   (secp256k1_fe *)0x10556c);
  secp256k1_fe_mul((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   (secp256k1_fe *)0x105588);
  memcpy(local_138,local_78,0x30);
  secp256k1_fe_add((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  memcpy(local_198,local_d8,0x30);
  secp256k1_fe_add((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  secp256k1_fe_sqr((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  secp256k1_fe_negate_unchecked
            ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),0);
  secp256k1_fe_mul((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   (secp256k1_fe *)0x105629);
  secp256k1_fe_add((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  iVar1 = secp256k1_fe_normalizes_to_zero((secp256k1_fe *)0x105648);
  memcpy(local_288,local_d8,0x30);
  secp256k1_fe_mul_int_unchecked
            ((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),in_stack_fffffffffffffd6c);
  secp256k1_fe_add((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  secp256k1_fe_cmov((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),
                    (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),0)
  ;
  secp256k1_fe_cmov((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),
                    (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),0)
  ;
  secp256k1_fe_sqr((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  secp256k1_fe_negate_unchecked
            ((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),
             (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),0);
  secp256k1_fe_mul((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   (secp256k1_fe *)0x105707);
  secp256k1_fe_sqr((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  secp256k1_fe_cmov((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),
                    (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),0)
  ;
  secp256k1_fe_sqr((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  secp256k1_fe_mul((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   (secp256k1_fe *)0x105764);
  secp256k1_fe_add((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  memcpy(local_8,local_138,0x30);
  secp256k1_fe_mul_int_unchecked
            ((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),in_stack_fffffffffffffd6c);
  secp256k1_fe_add((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  secp256k1_fe_mul((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   (secp256k1_fe *)0x1057cf);
  secp256k1_fe_add((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  secp256k1_fe_negate_unchecked
            ((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),
             (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),0);
  secp256k1_fe_half((secp256k1_fe *)0x105813);
  secp256k1_fe_cmov((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),
                    (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),0)
  ;
  secp256k1_fe_cmov((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),
                    (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),0)
  ;
  secp256k1_fe_cmov((secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffd70),
                    (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),0)
  ;
  iVar2 = secp256k1_fe_normalizes_to_zero((secp256k1_fe *)0x105898);
  *(int *)((long)local_8 + 0x90) = iVar2;
  secp256k1_gej_verify((secp256k1_gej *)CONCAT44(iVar1,in_stack_fffffffffffffd70));
  return;
}

Assistant:

static void secp256k1_gej_add_ge(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b) {
    /* Operations: 7 mul, 5 sqr, 21 add/cmov/half/mul_int/negate/normalizes_to_zero */
    secp256k1_fe zz, u1, u2, s1, s2, t, tt, m, n, q, rr;
    secp256k1_fe m_alt, rr_alt;
    int degenerate;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(b);
    VERIFY_CHECK(!b->infinity);

    /*  In:
     *    Eric Brier and Marc Joye, Weierstrass Elliptic Curves and Side-Channel Attacks.
     *    In D. Naccache and P. Paillier, Eds., Public Key Cryptography, vol. 2274 of Lecture Notes in Computer Science, pages 335-345. Springer-Verlag, 2002.
     *  we find as solution for a unified addition/doubling formula:
     *    lambda = ((x1 + x2)^2 - x1 * x2 + a) / (y1 + y2), with a = 0 for secp256k1's curve equation.
     *    x3 = lambda^2 - (x1 + x2)
     *    2*y3 = lambda * (x1 + x2 - 2 * x3) - (y1 + y2).
     *
     *  Substituting x_i = Xi / Zi^2 and yi = Yi / Zi^3, for i=1,2,3, gives:
     *    U1 = X1*Z2^2, U2 = X2*Z1^2
     *    S1 = Y1*Z2^3, S2 = Y2*Z1^3
     *    Z = Z1*Z2
     *    T = U1+U2
     *    M = S1+S2
     *    Q = -T*M^2
     *    R = T^2-U1*U2
     *    X3 = R^2+Q
     *    Y3 = -(R*(2*X3+Q)+M^4)/2
     *    Z3 = M*Z
     *  (Note that the paper uses xi = Xi / Zi and yi = Yi / Zi instead.)
     *
     *  This formula has the benefit of being the same for both addition
     *  of distinct points and doubling. However, it breaks down in the
     *  case that either point is infinity, or that y1 = -y2. We handle
     *  these cases in the following ways:
     *
     *    - If b is infinity we simply bail by means of a VERIFY_CHECK.
     *
     *    - If a is infinity, we detect this, and at the end of the
     *      computation replace the result (which will be meaningless,
     *      but we compute to be constant-time) with b.x : b.y : 1.
     *
     *    - If a = -b, we have y1 = -y2, which is a degenerate case.
     *      But here the answer is infinity, so we simply set the
     *      infinity flag of the result, overriding the computed values
     *      without even needing to cmov.
     *
     *    - If y1 = -y2 but x1 != x2, which does occur thanks to certain
     *      properties of our curve (specifically, 1 has nontrivial cube
     *      roots in our field, and the curve equation has no x coefficient)
     *      then the answer is not infinity but also not given by the above
     *      equation. In this case, we cmov in place an alternate expression
     *      for lambda. Specifically (y1 - y2)/(x1 - x2). Where both these
     *      expressions for lambda are defined, they are equal, and can be
     *      obtained from each other by multiplication by (y1 + y2)/(y1 + y2)
     *      then substitution of x^3 + 7 for y^2 (using the curve equation).
     *      For all pairs of nonzero points (a, b) at least one is defined,
     *      so this covers everything.
     */

    secp256k1_fe_sqr(&zz, &a->z);                       /* z = Z1^2 */
    u1 = a->x;                                          /* u1 = U1 = X1*Z2^2 (GEJ_X_M) */
    secp256k1_fe_mul(&u2, &b->x, &zz);                  /* u2 = U2 = X2*Z1^2 (1) */
    s1 = a->y;                                          /* s1 = S1 = Y1*Z2^3 (GEJ_Y_M) */
    secp256k1_fe_mul(&s2, &b->y, &zz);                  /* s2 = Y2*Z1^2 (1) */
    secp256k1_fe_mul(&s2, &s2, &a->z);                  /* s2 = S2 = Y2*Z1^3 (1) */
    t = u1; secp256k1_fe_add(&t, &u2);                  /* t = T = U1+U2 (GEJ_X_M+1) */
    m = s1; secp256k1_fe_add(&m, &s2);                  /* m = M = S1+S2 (GEJ_Y_M+1) */
    secp256k1_fe_sqr(&rr, &t);                          /* rr = T^2 (1) */
    secp256k1_fe_negate(&m_alt, &u2, 1);                /* Malt = -X2*Z1^2 (2) */
    secp256k1_fe_mul(&tt, &u1, &m_alt);                 /* tt = -U1*U2 (1) */
    secp256k1_fe_add(&rr, &tt);                         /* rr = R = T^2-U1*U2 (2) */
    /* If lambda = R/M = R/0 we have a problem (except in the "trivial"
     * case that Z = z1z2 = 0, and this is special-cased later on). */
    degenerate = secp256k1_fe_normalizes_to_zero(&m);
    /* This only occurs when y1 == -y2 and x1^3 == x2^3, but x1 != x2.
     * This means either x1 == beta*x2 or beta*x1 == x2, where beta is
     * a nontrivial cube root of one. In either case, an alternate
     * non-indeterminate expression for lambda is (y1 - y2)/(x1 - x2),
     * so we set R/M equal to this. */
    rr_alt = s1;
    secp256k1_fe_mul_int(&rr_alt, 2);       /* rr_alt = Y1*Z2^3 - Y2*Z1^3 (GEJ_Y_M*2) */
    secp256k1_fe_add(&m_alt, &u1);          /* Malt = X1*Z2^2 - X2*Z1^2 (GEJ_X_M+2) */

    secp256k1_fe_cmov(&rr_alt, &rr, !degenerate);       /* rr_alt (GEJ_Y_M*2) */
    secp256k1_fe_cmov(&m_alt, &m, !degenerate);         /* m_alt (GEJ_X_M+2) */
    /* Now Ralt / Malt = lambda and is guaranteed not to be Ralt / 0.
     * From here on out Ralt and Malt represent the numerator
     * and denominator of lambda; R and M represent the explicit
     * expressions x1^2 + x2^2 + x1x2 and y1 + y2. */
    secp256k1_fe_sqr(&n, &m_alt);                       /* n = Malt^2 (1) */
    secp256k1_fe_negate(&q, &t,
        SECP256K1_GEJ_X_MAGNITUDE_MAX + 1);             /* q = -T (GEJ_X_M+2) */
    secp256k1_fe_mul(&q, &q, &n);                       /* q = Q = -T*Malt^2 (1) */
    /* These two lines use the observation that either M == Malt or M == 0,
     * so M^3 * Malt is either Malt^4 (which is computed by squaring), or
     * zero (which is "computed" by cmov). So the cost is one squaring
     * versus two multiplications. */
    secp256k1_fe_sqr(&n, &n);                           /* n = Malt^4 (1) */
    secp256k1_fe_cmov(&n, &m, degenerate);              /* n = M^3 * Malt (GEJ_Y_M+1) */
    secp256k1_fe_sqr(&t, &rr_alt);                      /* t = Ralt^2 (1) */
    secp256k1_fe_mul(&r->z, &a->z, &m_alt);             /* r->z = Z3 = Malt*Z (1) */
    secp256k1_fe_add(&t, &q);                           /* t = Ralt^2 + Q (2) */
    r->x = t;                                           /* r->x = X3 = Ralt^2 + Q (2) */
    secp256k1_fe_mul_int(&t, 2);                        /* t = 2*X3 (4) */
    secp256k1_fe_add(&t, &q);                           /* t = 2*X3 + Q (5) */
    secp256k1_fe_mul(&t, &t, &rr_alt);                  /* t = Ralt*(2*X3 + Q) (1) */
    secp256k1_fe_add(&t, &n);                           /* t = Ralt*(2*X3 + Q) + M^3*Malt (GEJ_Y_M+2) */
    secp256k1_fe_negate(&r->y, &t,
        SECP256K1_GEJ_Y_MAGNITUDE_MAX + 2);             /* r->y = -(Ralt*(2*X3 + Q) + M^3*Malt) (GEJ_Y_M+3) */
    secp256k1_fe_half(&r->y);                           /* r->y = Y3 = -(Ralt*(2*X3 + Q) + M^3*Malt)/2 ((GEJ_Y_M+3)/2 + 1) */

    /* In case a->infinity == 1, replace r with (b->x, b->y, 1). */
    secp256k1_fe_cmov(&r->x, &b->x, a->infinity);
    secp256k1_fe_cmov(&r->y, &b->y, a->infinity);
    secp256k1_fe_cmov(&r->z, &secp256k1_fe_one, a->infinity);

    /* Set r->infinity if r->z is 0.
     *
     * If a->infinity is set, then r->infinity = (r->z == 0) = (1 == 0) = false,
     * which is correct because the function assumes that b is not infinity.
     *
     * Now assume !a->infinity. This implies Z = Z1 != 0.
     *
     * Case y1 = -y2:
     * In this case we could have a = -b, namely if x1 = x2.
     * We have degenerate = true, r->z = (x1 - x2) * Z.
     * Then r->infinity = ((x1 - x2)Z == 0) = (x1 == x2) = (a == -b).
     *
     * Case y1 != -y2:
     * In this case, we can't have a = -b.
     * We have degenerate = false, r->z = (y1 + y2) * Z.
     * Then r->infinity = ((y1 + y2)Z == 0) = (y1 == -y2) = false. */
    r->infinity = secp256k1_fe_normalizes_to_zero(&r->z);

    SECP256K1_GEJ_VERIFY(r);
}